

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O3

int Zyx_ManAddCnfLazyFunc(Zyx_Man_t *p,int iMint)

{
  int iVar1;
  Bmc_EsPar_t *pBVar2;
  bool bVar3;
  int iVar4;
  int (*paiVar5) [32];
  uint uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  
  pBVar2 = p->pPars;
  if ((pBVar2->fMajority != 0) || (3 < pBVar2->nLutSize)) {
    __assert_fail("!p->pPars->fMajority && p->pPars->nLutSize < 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                  ,0x427,"int Zyx_ManAddCnfLazyFunc(Zyx_Man_t *, int)");
  }
  p->Counts[iMint] = p->Counts[iMint] + 1;
  if (pBVar2->nLutSize == 3) {
    uVar13 = pBVar2->nVars;
    iVar4 = p->nObjs;
    if ((int)uVar13 < iVar4) {
      do {
        if (0 < (int)uVar13) {
          paiVar5 = p->pFanins + uVar13;
          uVar6 = 0;
          do {
            uVar11 = uVar6 + 1;
            uVar7 = uVar11;
            while ((uVar14 = uVar7, (int)uVar14 < (int)uVar13 &&
                   (uVar7 = uVar14 + 1, (int)uVar7 < (int)uVar13))) {
              iVar4 = p->LutMask;
              uVar12 = uVar7;
              do {
                (*paiVar5)[0] = uVar6;
                (*paiVar5)[1] = uVar14;
                (*paiVar5)[2] = uVar12;
                if (-1 < iVar4) {
                  uVar10 = 0;
                  do {
                    iVar4 = 0;
                    bVar3 = true;
                    do {
                      bVar15 = bVar3;
                      p->nLits[0] = 0;
                      pBVar2 = p->pPars;
                      iVar8 = (uVar13 - pBVar2->nVars) * (p->LutMask + 1) + uVar10;
                      if (iVar8 < 0) goto LAB_005b0dc9;
                      p->nLits[0] = 1;
                      p->pLits[0][0] = iVar4 + iVar8 * 2;
                      if (0 < pBVar2->nLutSize) {
                        lVar9 = 0;
                        do {
                          iVar8 = p->TopoBase + p->pFanins[uVar13][lVar9] +
                                  (uVar13 - pBVar2->nVars) * p->nObjs;
                          if (iVar8 < 0) goto LAB_005b0dc9;
                          iVar1 = p->nLits[0];
                          p->nLits[0] = iVar1 + 1;
                          p->pLits[0][iVar1] = iVar8 * 2 + 1;
                          iVar8 = p->MintBase + p->pFanins[uVar13][lVar9] + p->nObjs * iMint;
                          if (iVar8 < 0) goto LAB_005b0dc9;
                          iVar1 = p->nLits[0];
                          p->nLits[0] = iVar1 + 1;
                          p->pLits[0][iVar1] =
                               (uint)((uVar10 >> ((uint)lVar9 & 0x1f) & 1) != 0) + iVar8 * 2;
                          lVar9 = lVar9 + 1;
                        } while (lVar9 < pBVar2->nLutSize);
                      }
                      iVar8 = p->MintBase + uVar13 + p->nObjs * iMint;
                      if (iVar8 < 0) goto LAB_005b0dc9;
                      iVar1 = p->nLits[0];
                      p->nLits[0] = iVar1 + 1;
                      p->pLits[0][iVar1] = iVar4 + iVar8 * 2 ^ 1;
                      iVar4 = bmcg_sat_solver_addclause(p->pSat,p->pLits[0],p->nLits[0]);
                      if (iVar4 == 0) {
                        return 0;
                      }
                      iVar4 = 1;
                      bVar3 = false;
                    } while (bVar15);
                    iVar4 = p->LutMask;
                    bVar3 = (int)uVar10 < iVar4;
                    uVar10 = uVar10 + 1;
                  } while (bVar3);
                }
                uVar12 = uVar12 + 1;
              } while ((int)uVar12 < (int)uVar13);
            }
            uVar6 = uVar11;
          } while (uVar11 != uVar13);
          iVar4 = p->nObjs;
        }
        uVar13 = uVar13 + 1;
      } while ((int)uVar13 < iVar4);
    }
  }
  else if (pBVar2->nLutSize == 2) {
    uVar13 = pBVar2->nVars;
    iVar4 = p->nObjs;
    if ((int)uVar13 < iVar4) {
      do {
        if (0 < (int)uVar13) {
          uVar6 = 0;
          do {
            uVar7 = uVar6 + 1;
            if ((int)uVar7 < (int)uVar13) {
              iVar4 = p->LutMask;
              uVar11 = uVar7;
              do {
                p->pFanins[uVar13][0] = uVar6;
                p->pFanins[uVar13][1] = uVar11;
                if (-1 < iVar4) {
                  uVar14 = 0;
                  do {
                    iVar4 = 0;
                    bVar3 = true;
                    do {
                      bVar15 = bVar3;
                      p->nLits[0] = 0;
                      pBVar2 = p->pPars;
                      iVar8 = (uVar13 - pBVar2->nVars) * (p->LutMask + 1) + uVar14;
                      if (iVar8 < 0) {
LAB_005b0dc9:
                        __assert_fail("Var >= 0 && !(c >> 1)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                      ,0x12e,"int Abc_Var2Lit(int, int)");
                      }
                      p->nLits[0] = 1;
                      p->pLits[0][0] = iVar4 + iVar8 * 2;
                      if (0 < pBVar2->nLutSize) {
                        lVar9 = 0;
                        do {
                          iVar8 = p->TopoBase + p->pFanins[uVar13][lVar9] +
                                  (uVar13 - pBVar2->nVars) * p->nObjs;
                          if (iVar8 < 0) goto LAB_005b0dc9;
                          iVar1 = p->nLits[0];
                          p->nLits[0] = iVar1 + 1;
                          p->pLits[0][iVar1] = iVar8 * 2 + 1;
                          iVar8 = p->MintBase + p->pFanins[uVar13][lVar9] + p->nObjs * iMint;
                          if (iVar8 < 0) goto LAB_005b0dc9;
                          iVar1 = p->nLits[0];
                          p->nLits[0] = iVar1 + 1;
                          p->pLits[0][iVar1] =
                               (uint)((uVar14 >> ((uint)lVar9 & 0x1f) & 1) != 0) + iVar8 * 2;
                          lVar9 = lVar9 + 1;
                        } while (lVar9 < pBVar2->nLutSize);
                      }
                      iVar8 = p->MintBase + uVar13 + p->nObjs * iMint;
                      if (iVar8 < 0) goto LAB_005b0dc9;
                      iVar1 = p->nLits[0];
                      p->nLits[0] = iVar1 + 1;
                      p->pLits[0][iVar1] = iVar4 + iVar8 * 2 ^ 1;
                      iVar4 = bmcg_sat_solver_addclause(p->pSat,p->pLits[0],p->nLits[0]);
                      if (iVar4 == 0) {
                        return 0;
                      }
                      iVar4 = 1;
                      bVar3 = false;
                    } while (bVar15);
                    iVar4 = p->LutMask;
                    bVar3 = (int)uVar14 < iVar4;
                    uVar14 = uVar14 + 1;
                  } while (bVar3);
                }
                uVar11 = uVar11 + 1;
              } while ((int)uVar11 < (int)uVar13);
            }
            uVar6 = uVar7;
          } while (uVar7 != uVar13);
          iVar4 = p->nObjs;
        }
        uVar13 = uVar13 + 1;
      } while ((int)uVar13 < iVar4);
    }
  }
  return 1;
}

Assistant:

int Zyx_ManAddCnfLazyFunc( Zyx_Man_t * p, int iMint )
{
    int i, k, n, j, s, t, u;
    //printf( "Adding clauses for minterm %d with value %d.\n", iMint, Value );
    assert( !p->pPars->fMajority && p->pPars->nLutSize < 4 );
    p->Counts[iMint]++;
    if ( p->pPars->nLutSize == 2 )
    {
        for ( i = p->pPars->nVars; i < p->nObjs; i++ )
        for ( s = 0;               s < i;        s++ )
        for ( t = s+1;             t < i;        t++ )
        {
            p->pFanins[i][0] = s;
            p->pFanins[i][1] = t;
            for ( k = 0; k <= p->LutMask; k++ )
            for ( n = 0; n < 2; n++ )
            {
                p->nLits[0] = 0;
                p->pLits[0][p->nLits[0]++] = Abc_Var2Lit( Zyx_FuncVar(p, i, k), n );
                for ( j = 0; j < p->pPars->nLutSize; j++ )
                {
                    p->pLits[0][p->nLits[0]++] = Abc_Var2Lit( Zyx_TopoVar(p, i, p->pFanins[i][j]), 1 );
                    p->pLits[0][p->nLits[0]++] = Abc_Var2Lit( Zyx_MintVar(p, iMint, p->pFanins[i][j]), (k >> j) & 1 );
                }
                p->pLits[0][p->nLits[0]++] = Abc_Var2Lit( Zyx_MintVar(p, iMint, i), !n );
                if ( !bmcg_sat_solver_addclause( p->pSat, p->pLits[0], p->nLits[0] ) )
                    return 0;
            }
        }
    }
    else if ( p->pPars->nLutSize == 3 )
    {
        for ( i = p->pPars->nVars; i < p->nObjs; i++ )
        for ( s = 0;               s < i;        s++ )
        for ( t = s+1;             t < i;        t++ )
        for ( u = t+1;             u < i;        u++ )
        {
            p->pFanins[i][0] = s;
            p->pFanins[i][1] = t;
            p->pFanins[i][2] = u;
            for ( k = 0; k <= p->LutMask; k++ )
            for ( n = 0; n < 2; n++ )
            {
                p->nLits[0] = 0;
                p->pLits[0][p->nLits[0]++] = Abc_Var2Lit( Zyx_FuncVar(p, i, k), n );
                for ( j = 0; j < p->pPars->nLutSize; j++ )
                {
                    p->pLits[0][p->nLits[0]++] = Abc_Var2Lit( Zyx_TopoVar(p, i, p->pFanins[i][j]), 1 );
                    p->pLits[0][p->nLits[0]++] = Abc_Var2Lit( Zyx_MintVar(p, iMint, p->pFanins[i][j]), (k >> j) & 1 );
                }
                p->pLits[0][p->nLits[0]++] = Abc_Var2Lit( Zyx_MintVar(p, iMint, i), !n );
                if ( !bmcg_sat_solver_addclause( p->pSat, p->pLits[0], p->nLits[0] ) )
                    return 0;
            }
        }
    }
    return 1;
}